

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfig *_config,IEventListenerPtr *reporter)

{
  IEventListener *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  size_type extraout_RDX;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00323d40;
  iVar2 = (*_config->_vptr_IConfig[3])(_config);
  (this->m_runInfo).name.m_start = (char *)CONCAT44(extraout_var,iVar2);
  (this->m_runInfo).name.m_size = extraout_RDX;
  this->m_activeTestCase = (TestCaseHandle *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  (this->m_lastResult).nullableValue = (AssertionResult *)0x0;
  this->m_config = _config;
  (this->m_totals).assertions.passed = 0;
  (this->m_totals).assertions.failed = 0;
  (this->m_totals).assertions.failedButOk = 0;
  (this->m_totals).assertions.skipped = 0;
  (this->m_totals).testCases.passed = 0;
  (this->m_totals).testCases.failed = 0;
  (this->m_totals).testCases.failedButOk = 0;
  (this->m_totals).testCases.skipped = 0;
  (this->m_reporter).m_ptr = reporter->m_ptr;
  reporter->m_ptr = (IEventListener *)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_messageScopes).
  super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).lineInfo.file = "";
  (this->m_lastAssertionInfo).lineInfo.line = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (char *)0x0;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unfinishedSections).
  super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_activeSections).
  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_trackerContext).m_rootTracker.m_ptr = (ITracker *)0x0;
  (this->m_trackerContext).m_currentTracker = (ITracker *)0x0;
  (this->m_trackerContext).m_runState = NotStarted;
  FatalConditionHandler::FatalConditionHandler(&this->m_fatalConditionhandler);
  this->m_lastAssertionPassed = false;
  this->m_shouldReportUnexpected = true;
  iVar2 = (*this->m_config->_vptr_IConfig[4])();
  bVar3 = true;
  if ((char)iVar2 == '\0') {
    pIVar1 = (this->m_reporter).m_ptr;
    if (pIVar1 == (IEventListener *)0x0) goto LAB_00155e16;
    bVar3 = (pIVar1->m_preferences).shouldReportAllAssertions;
  }
  this->m_includeSuccessfulResults = bVar3;
  if (Context::currentContext == (undefined8 *)0x0) {
    Context::currentContext = (undefined8 *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  Context::currentContext[1] = this;
  pIVar1 = (this->m_reporter).m_ptr;
  if (pIVar1 != (IEventListener *)0x0) {
    (*pIVar1->_vptr_IEventListener[4])(pIVar1,&this->m_runInfo);
    return;
  }
LAB_00155e16:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
               );
}

Assistant:

RunContext::RunContext(IConfig const* _config, IEventListenerPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_config(_config),
        m_reporter(CATCH_MOVE(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        getCurrentMutableContext().setResultCapture( this );
        m_reporter->testRunStarting(m_runInfo);
    }